

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pzmanvector.h
# Opt level: O2

void __thiscall
TPZManVector<std::complex<double>,_10>::Resize
          (TPZManVector<std::complex<double>,_10> *this,int64_t newsize,complex<double> *object)

{
  undefined8 *puVar1;
  undefined8 *puVar2;
  undefined8 uVar3;
  ostream *poVar4;
  complex<double> *pcVar5;
  complex<double> *pcVar6;
  complex<double> *pcVar7;
  long lVar8;
  long lVar9;
  long lVar10;
  ulong uVar11;
  double dVar12;
  
  if (newsize < 0) {
    poVar4 = std::operator<<((ostream *)&std::cerr,"TManVec::Resize. Bad parameter newsize.");
    std::endl<char,std::char_traits<char>>(poVar4);
    std::ostream::flush();
    return;
  }
  lVar9 = (this->super_TPZVec<std::complex<double>_>).fNElements;
  if (lVar9 != newsize) {
    lVar10 = (this->super_TPZVec<std::complex<double>_>).fNAlloc;
    if (lVar10 < newsize) {
      if ((ulong)newsize < 0xb) {
        pcVar6 = (this->super_TPZVec<std::complex<double>_>).fStore;
        pcVar5 = this->fExtAlloc;
        lVar8 = 0;
        lVar10 = lVar9;
        if (lVar9 < 1) {
          lVar9 = lVar8;
          lVar10 = lVar8;
        }
        while (lVar9 != 0) {
          puVar1 = (undefined8 *)(pcVar6->_M_value + lVar8);
          uVar3 = puVar1[1];
          *(undefined8 *)(pcVar5->_M_value + lVar8) = *puVar1;
          *(undefined8 *)((long)(pcVar5->_M_value + lVar8) + 8) = uVar3;
          lVar8 = lVar8 + 0x10;
          lVar9 = lVar9 + -1;
        }
        pcVar6 = this->fExtAlloc + lVar10;
        for (; lVar10 < newsize; lVar10 = lVar10 + 1) {
          uVar3 = *(undefined8 *)(object->_M_value + 8);
          *(undefined8 *)pcVar6->_M_value = *(undefined8 *)object->_M_value;
          *(undefined8 *)(pcVar6->_M_value + 8) = uVar3;
          pcVar6 = pcVar6 + 1;
        }
        pcVar6 = (this->super_TPZVec<std::complex<double>_>).fStore;
        if (pcVar6 != (complex<double> *)0x0 && pcVar6 != pcVar5) {
          operator_delete__(pcVar6);
        }
        (this->super_TPZVec<std::complex<double>_>).fStore = pcVar5;
        (this->super_TPZVec<std::complex<double>_>).fNElements = newsize;
        (this->super_TPZVec<std::complex<double>_>).fNAlloc = 10;
      }
      else {
        dVar12 = (double)lVar10 * 1.2;
        uVar11 = (long)dVar12;
        if (dVar12 < (double)newsize) {
          uVar11 = newsize;
        }
        pcVar5 = (complex<double> *)operator_new__(-(ulong)(uVar11 >> 0x3c != 0) | uVar11 << 4);
        if (uVar11 != 0) {
          memset(pcVar5,0,uVar11 << 4);
        }
        pcVar6 = (this->super_TPZVec<std::complex<double>_>).fStore;
        lVar8 = 0;
        lVar10 = lVar9;
        if (lVar9 < 1) {
          lVar9 = lVar8;
          lVar10 = lVar8;
        }
        while (lVar9 != 0) {
          puVar1 = (undefined8 *)((long)pcVar6->_M_value + lVar8);
          uVar3 = puVar1[1];
          puVar2 = (undefined8 *)((long)pcVar5->_M_value + lVar8);
          *puVar2 = *puVar1;
          puVar2[1] = uVar3;
          lVar8 = lVar8 + 0x10;
          lVar9 = lVar9 + -1;
        }
        pcVar7 = pcVar5 + lVar10;
        for (; lVar10 < newsize; lVar10 = lVar10 + 1) {
          uVar3 = *(undefined8 *)(object->_M_value + 8);
          *(undefined8 *)pcVar7->_M_value = *(undefined8 *)object->_M_value;
          *(undefined8 *)((long)pcVar7->_M_value + 8) = uVar3;
          pcVar7 = pcVar7 + 1;
        }
        if (pcVar6 != (complex<double> *)0x0 && pcVar6 != this->fExtAlloc) {
          operator_delete__(pcVar6);
        }
        (this->super_TPZVec<std::complex<double>_>).fStore = pcVar5;
        (this->super_TPZVec<std::complex<double>_>).fNElements = newsize;
        (this->super_TPZVec<std::complex<double>_>).fNAlloc = uVar11;
      }
    }
    else {
      lVar10 = lVar9 << 4;
      for (; lVar9 < newsize; lVar9 = lVar9 + 1) {
        uVar3 = *(undefined8 *)(object->_M_value + 8);
        puVar1 = (undefined8 *)
                 (((this->super_TPZVec<std::complex<double>_>).fStore)->_M_value + lVar10);
        *puVar1 = *(undefined8 *)object->_M_value;
        puVar1[1] = uVar3;
        lVar10 = lVar10 + 0x10;
      }
      (this->super_TPZVec<std::complex<double>_>).fNElements = newsize;
    }
  }
  return;
}

Assistant:

void TPZManVector< T, NumExtAlloc >::Resize(const int64_t newsize, const T& object) {
#ifndef PZNODEBUG
    if (newsize < 0) {
        PZError << "TManVec::Resize. Bad parameter newsize." << std::endl;
        PZError.flush();
        return;
    }
    if (newsize == this->fNElements)
        return;
#endif

    if (newsize <= this->fNAlloc) {
        for (int64_t i = this->fNElements; i < newsize; i++)
            this->fStore[i] = object;

        this->fNElements = newsize;
    } else if (newsize <= NumExtAlloc) { // that is, fExtAlloc != this->fStore. Moreover : this->fNElements <= this->fNAlloc
        // <= NumExtAlloc

        int64_t i;

        for (i = 0L; i < this->fNElements; i++) {
            fExtAlloc[i] = this->fStore[i];
        }

        for (; i < newsize; i++)
            fExtAlloc[i] = object;

        if (this->fStore != fExtAlloc) delete [] this->fStore;

        this->fStore = fExtAlloc;
        this->fNElements = newsize;
        this->fNAlloc = NumExtAlloc;
    } else { // the size is larger than the allocated memory, then this->fNElements
        // is always lower than newsize because fNElemets <=this->fNAllocs
        int64_t i, realsize = ExpandSize(newsize);

        T* newstore = new T[realsize];

        for (i = 0L; i < this->fNElements; i++) {
            newstore[i] = this->fStore[i];
        }

        for (; i < newsize; i++)
            newstore[i] = object;

        if (this->fStore != fExtAlloc)
            delete[]this->fStore;

        this->fStore = newstore;
        this->fNElements = newsize;
        this->fNAlloc = realsize;
    }
}